

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_upload_flags(OperationConfig *config,char *flag)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *__s2;
  size_t sVar6;
  flagmap *pfVar7;
  
  if (flag != (char *)0x0) {
    do {
      pfVar7 = flag_table;
      pcVar4 = strchr(flag,0x2c);
      if (pcVar4 == (char *)0x0) {
        sVar6 = strlen(flag);
      }
      else {
        sVar6 = (long)pcVar4 - (long)flag;
      }
      cVar1 = *flag;
      uVar5 = (ulong)(cVar1 == '-');
      sVar6 = sVar6 - uVar5;
      __s2 = "answered";
      while ((pfVar7 = pfVar7 + 1, sVar6 != pfVar7[-1].len ||
             (iVar3 = strncmp(flag + uVar5,__s2,sVar6), iVar3 != 0))) {
        __s2 = pfVar7->name;
        if (__s2 == (char *)0x0) {
          return PARAM_OPTION_UNKNOWN;
        }
      }
      if (cVar1 == '-') {
        bVar2 = ~pfVar7[-1].flag & config->upload_flags;
      }
      else {
        bVar2 = pfVar7[-1].flag | config->upload_flags;
      }
      flag = pcVar4 + 1;
      config->upload_flags = bVar2;
    } while (pcVar4 != (char *)0x0);
  }
  return PARAM_OK;
}

Assistant:

static ParameterError parse_upload_flags(struct OperationConfig *config,
                                         const char *flag)
{
  ParameterError err = PARAM_OK;

  while(flag) {
    bool negate;
    const struct flagmap *map;
    size_t len;
    char *next = strchr(flag, ','); /* Find next comma or end */
    if(next)
      len = next - flag;
    else
      len = strlen(flag);

    negate = (*flag == '-');
    if(negate) {
      flag++;
      len--;
    }

    for(map = flag_table; map->name; map++) {
      if((len == map->len) && !strncmp(flag, map->name, map->len)) {
        if(negate)
          config->upload_flags &= (unsigned char)~map->flag;
        else
          config->upload_flags |= map->flag;
        break;
      }
    }

   if(!map->name) {
     err = PARAM_OPTION_UNKNOWN;
     break;
   }

   if(next)
     /* move over the comma */
     next++;
   flag = next;
  }

  return err;
}